

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

bool StringFormatter<unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
     ::output_wchar<unsigned_long>(ostream *os,unsigned_long *value)

{
  unsigned_long uVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<wchar_t> local_39;
  wstring local_38 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> wc;
  unsigned_long *value_local;
  ostream *os_local;
  
  uVar1 = *value;
  wc.field_2._8_8_ = value;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_38,1,(wchar_t)uVar1,&local_39);
  std::allocator<wchar_t>::~allocator(&local_39);
  string::convert<char,std::__cxx11::wstring>(&local_70,(string *)local_38,src);
  std::operator<<(os,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::wstring::~wstring(local_38);
  return true;
}

Assistant:

static bool output_wchar(std::ostream& os, const T& value)
    { 
        if constexpr (std::is_integral_v<T>) {
            std::basic_string<wchar_t> wc(1, wchar_t(value));
            os << string::convert<char>(wc);
            return true;
        }
        return false;
    }